

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O3

Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> __thiscall
kj::anon_unknown_0::LowLevelAsyncIoProviderImpl::wrapConnectingSocketFd
          (LowLevelAsyncIoProviderImpl *this,int fd,sockaddr *addr,uint addrlen,uint flags)

{
  PromiseArena *pPVar1;
  undefined1 auVar2 [8];
  _func_int **pp_Var3;
  PromiseArena *pPVar4;
  char *pcVar5;
  size_t sVar6;
  AsyncIoStream *pAVar7;
  int iVar8;
  int *piVar9;
  void *pvVar10;
  undefined4 in_register_0000000c;
  int __fd;
  undefined4 in_register_00000034;
  ulong in_R9;
  TransformPromiseNodeBase *this_00;
  Promise<void> connected;
  String address;
  Fault f;
  undefined1 local_108 [8];
  _func_int **local_100;
  PromiseArena *local_f8;
  Fault local_f0;
  String local_e8;
  OwnPromiseNode local_d0;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_c8;
  SocketAddress local_b8;
  
  heap<kj::(anonymous_namespace)::AsyncStreamFd,kj::UnixEventPort&,int&,unsigned_int&,kj::UnixEventPort::FdObserver::Flags>
            ((kj *)&local_100,*(UnixEventPort **)(CONCAT44(in_register_00000034,fd) + 8),(int *)addr
             ,(uint *)(in_R9 & 0xffffffff),(Flags *)0x3);
  do {
    __fd = (int)addr;
    iVar8 = ::connect(__fd,(sockaddr *)CONCAT44(in_register_0000000c,addrlen),flags);
    if (-1 < iVar8) goto LAB_004317e0;
    piVar9 = __errno_location();
    iVar8 = *piVar9;
  } while (iVar8 == 4);
  if (iVar8 == 0x73) {
LAB_004317e0:
    pPVar4 = local_f8;
    local_e8.content.ptr = (char *)CONCAT44(4,*(int *)(local_f8->bytes + 0x10));
    local_d0.ptr = (PromiseNode *)this;
    do {
      iVar8 = poll((pollfd *)&local_e8,1,0);
      if (-1 < iVar8) {
        if (iVar8 != 0) goto LAB_00431875;
        UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_108);
        goto LAB_00431889;
      }
      iVar8 = kj::_::Debug::getOsErrorNumber(false);
    } while (iVar8 == -1);
    if (iVar8 != 0) {
      local_f0.exception = (Exception *)0x0;
      local_b8.addrlen = 0;
      local_b8.wildcard = false;
      local_b8._5_3_ = 0;
      local_b8.addr._0_8_ = 0;
      kj::_::Debug::Fault::init
                (&local_f0,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                );
      kj::_::Debug::Fault::fatal(&local_f0);
    }
LAB_00431875:
    kj::_::readyNow();
    local_108._0_4_ = local_b8.addrlen;
    local_108[4] = local_b8.wildcard;
    local_108._5_3_ = local_b8._5_3_;
LAB_00431889:
    pp_Var3 = local_100;
    auVar2 = local_108;
    local_f8 = (PromiseArena *)0x0;
    pPVar1 = ((PromiseArenaMember *)local_108)->arena;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_108 - (long)pPVar1) < 0x38) {
      pvVar10 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar10 + 0x3c8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_108,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1519:27)>
                 ::anon_class_24_2_651ff19b_for_func::operator());
      *(undefined ***)((long)pvVar10 + 0x3c8) = &PTR_destroy_00625410;
      *(int *)((long)pvVar10 + 1000) = __fd;
      *(_func_int ***)((long)pvVar10 + 0x3f0) = pp_Var3;
      *(PromiseArena **)((long)pvVar10 + 0x3f8) = pPVar4;
      *(void **)((long)pvVar10 + 0x3d0) = pvVar10;
    }
    else {
      ((PromiseArenaMember *)local_108)->arena = (PromiseArena *)0x0;
      this_00 = (TransformPromiseNodeBase *)
                &((PromiseArenaMember *)((long)local_108 + -0x40))->arena;
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)local_108,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++:1519:27)>
                 ::anon_class_24_2_651ff19b_for_func::operator());
      ((PromiseArenaMember *)((long)auVar2 + -0x40))->arena = (PromiseArena *)&PTR_destroy_00625410;
      *(int *)&((PromiseArenaMember *)((long)auVar2 + -0x20))->arena = __fd;
      ((PromiseArenaMember *)((long)auVar2 + -0x10))->_vptr_PromiseArenaMember = pp_Var3;
      ((PromiseArenaMember *)((long)auVar2 + -0x10))->arena = pPVar4;
      ((PromiseArenaMember *)((long)auVar2 + -0x30))->_vptr_PromiseArenaMember =
           (_func_int **)pPVar1;
    }
    this = (LowLevelAsyncIoProviderImpl *)local_d0.ptr;
    auVar2 = local_108;
    ((local_d0.ptr)->super_PromiseArenaMember)._vptr_PromiseArenaMember = (_func_int **)this_00;
    if (local_108 != (undefined1  [8])0x0) {
      local_108 = (undefined1  [8])0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)auVar2);
    }
  }
  else {
    SocketAddress::SocketAddress(&local_b8,(sockaddr *)CONCAT44(in_register_0000000c,addrlen),flags)
    ;
    SocketAddress::toString(&local_e8,&local_b8);
    kj::_::Debug::Fault::Fault<int,kj::String&>
              ((Fault *)&local_b8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
               ,0x5e5,iVar8,"connect()","address",&local_e8);
    kj::_::Debug::Fault::~Fault((Fault *)&local_b8);
    local_c8.disposer = (Disposer *)0x0;
    local_c8.ptr = (AsyncIoStream *)0x0;
    kj::_::PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<kj::Own<kj::AsyncIoStream,decltype(nullptr)>>,kj::_::PromiseDisposer,kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
              ((PromiseDisposer *)this,&local_c8);
    pAVar7 = local_c8.ptr;
    if (local_c8.ptr != (AsyncIoStream *)0x0) {
      local_c8.ptr = (AsyncIoStream *)0x0;
      (**(local_c8.disposer)->_vptr_Disposer)
                (local_c8.disposer,
                 (pAVar7->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                 (long)&(pAVar7->super_AsyncInputStream)._vptr_AsyncInputStream);
    }
    sVar6 = local_e8.content.size_;
    pcVar5 = local_e8.content.ptr;
    if ((pollfd)local_e8.content.ptr != (pollfd)0x0) {
      local_e8.content.ptr = (char *)0x0;
      local_e8.content.size_ = 0;
      (**(local_e8.content.disposer)->_vptr_ArrayDisposer)
                (local_e8.content.disposer,pcVar5,1,sVar6,sVar6,0);
    }
  }
  if (local_f8 != (PromiseArena *)0x0) {
    (**(code **)*local_100)(local_100,local_f8->bytes + *(long *)(*(long *)local_f8->bytes + -0x10))
    ;
  }
  return (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_>)(PromiseNode *)this;
}

Assistant:

Promise<Own<AsyncIoStream>> wrapConnectingSocketFd(
      int fd, const struct sockaddr* addr, uint addrlen, uint flags = 0) override {
    // It's important that we construct the AsyncStreamFd first, so that `flags` are honored,
    // especially setting nonblocking mode and taking ownership.
    auto result = heap<AsyncStreamFd>(eventPort, fd, flags,
                                      UnixEventPort::FdObserver::OBSERVE_READ_WRITE);

    // Unfortunately connect() doesn't fit the mold of KJ_NONBLOCKING_SYSCALL, since it indicates
    // non-blocking using EINPROGRESS.
    for (;;) {
      if (::connect(fd, addr, addrlen) < 0) {
        int error = errno;
        if (error == EINPROGRESS) {
          // Fine.
          break;
        } else if (error != EINTR) {
          auto address = SocketAddress(addr, addrlen).toString();
          KJ_FAIL_SYSCALL("connect()", error, address) { break; }
          return Own<AsyncIoStream>();
        }
      } else {
        // no error
        break;
      }
    }

    auto connected = result->waitConnected();
    return connected.then([fd,stream=kj::mv(result)]() mutable -> Own<AsyncIoStream> {
      int err;
      socklen_t errlen = sizeof(err);
      KJ_SYSCALL(getsockopt(fd, SOL_SOCKET, SO_ERROR, &err, &errlen));
      if (err != 0) {
        KJ_FAIL_SYSCALL("connect()", err) { break; }
      }
      return kj::mv(stream);
    });
  }